

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

int GetIArg(size_t *i,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *opt)

{
  int iVar1;
  string errstr;
  string str;
  
  GetNextArg(&str,i,opt);
  iVar1 = std::__cxx11::stoi(&str,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&str);
  return iVar1;
}

Assistant:

int GetIArg(size_t & i, const std::vector<std::string> & opt)
{
    std::string str = GetNextArg(i, opt);
    try {
        return stoi(str);
    }
    catch(...)
    {
        std::string errstr("Cannot convert to int: ");
        errstr += str;
        throw std::runtime_error(errstr);
    }
}